

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O2

ostream * tcu::operator<<(ostream *stream,Vector<int,_4> *vec)

{
  int i;
  long lVar1;
  
  std::operator<<(stream,"(");
  lVar1 = 0;
  do {
    if (lVar1 != 0) {
      if (lVar1 == 4) {
        std::operator<<(stream,")");
        return stream;
      }
      std::operator<<(stream,", ");
    }
    std::ostream::operator<<(stream,vec->m_data[lVar1]);
    lVar1 = lVar1 + 1;
  } while( true );
}

Assistant:

std::ostream& operator<< (std::ostream& stream, const tcu::Vector<T, Size>& vec)
{
	stream << "(";
	for (int i = 0; i < Size; i++)
	{
		if (i != 0)
			stream << ", ";
		stream << vec.m_data[i];
	}
	stream << ")";
	return stream;
}